

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O2

optional<std::array<tinyusdz::value::half,_3UL>_> * __thiscall
tinyusdz::primvar::PrimVar::get_default_value<std::array<tinyusdz::value::half,3ul>>
          (optional<std::array<tinyusdz::value::half,_3UL>_> *__return_storage_ptr__,PrimVar *this)

{
  optional<std::array<tinyusdz::value::half,_3UL>_> in_RAX;
  optional<std::array<tinyusdz::value::half,_3UL>_> local_18;
  
  local_18 = in_RAX;
  get_value<std::array<tinyusdz::value::half,3ul>>(&local_18,this);
  __return_storage_ptr__->has_value_ = local_18.has_value_;
  if (local_18.has_value_ == true) {
    *(undefined2 *)((long)&__return_storage_ptr__->contained + 4) = local_18.contained._4_2_;
    *(undefined4 *)&__return_storage_ptr__->contained = local_18.contained._0_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_default_value() const {
    return get_value<T>();
  }